

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

int __thiscall QFileDevice::close(QFileDevice *this,int __fd)

{
  QIODevicePrivate *pQVar1;
  bool bVar2;
  char cVar3;
  int extraout_EAX;
  FileError FVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    bVar2 = flush(this);
    QIODevice::close(&this->super_QIODevice,__fd);
    *(undefined1 *)&pQVar1[1].transactionPos = 0;
    QIODevicePrivate::QRingBufferRef::clear(&pQVar1->writeBuffer);
    pQVar1[1].pos = 0;
    cVar3 = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x18))();
    if ((bVar2) && (cVar3 != '\0')) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        unsetError(this);
        return extraout_EAX;
      }
      goto LAB_0010bfc4;
    }
    if (bVar2) {
      FVar4 = QAbstractFileEngine::error((QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
      QAbstractFileEngine::errorString
                ((QString *)&QStack_38,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
      *(FileError *)((long)&pQVar1[1].devicePos + 4) = FVar4;
      QString::operator=(&pQVar1->errorString,(QString *)&QStack_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_0010bfc4:
  __stack_chk_fail();
}

Assistant:

void QFileDevice::close()
{
    Q_D(QFileDevice);
    if (!isOpen())
        return;
    bool flushed = flush();
    QIODevice::close();

    // reset write buffer
    d->lastWasWrite = false;
    d->writeBuffer.clear();

    // reset cached size
    d->cachedSize = 0;

    // If flush() succeeded but close() failed, copy its error condition;
    // otherwise, keep the earlier flush() error.
    if (d->fileEngine->close() && flushed)
        unsetError();
    else if (flushed)
        d->setError(d->fileEngine->error(), d->fileEngine->errorString());
}